

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QMimeMagicRuleMatcher>::copyAppend
          (QGenericArrayOps<QMimeMagicRuleMatcher> *this,QMimeMagicRuleMatcher *b,
          QMimeMagicRuleMatcher *e)

{
  qsizetype *pqVar1;
  QMimeMagicRuleMatcher *pQVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QMimeMagicRuleMatcher>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QMimeMagicRuleMatcher>).size;
      pDVar4 = (b->m_list).d.d;
      pQVar2[lVar3].m_list.d.d = pDVar4;
      pQVar2[lVar3].m_list.d.ptr = (b->m_list).d.ptr;
      pQVar2[lVar3].m_list.d.size = (b->m_list).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar2[lVar3].m_priority = b->m_priority;
      pDVar5 = (b->m_mimetype).d.d;
      pQVar2[lVar3].m_mimetype.d.d = pDVar5;
      pQVar2[lVar3].m_mimetype.d.ptr = (b->m_mimetype).d.ptr;
      pQVar2[lVar3].m_mimetype.d.size = (b->m_mimetype).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QMimeMagicRuleMatcher>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }